

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

ArenaAllocator * __thiscall Js::ScriptContext::AllocatorForDiagnostics(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  HeapAllocator *alloc;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  undefined4 *puVar3;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (this->diagnosticArena == (ArenaAllocator *)0x0) {
    local_48 = (undefined1  [8])&Memory::ArenaAllocator::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2d86450;
    data.filename._0_4_ = 0x5d6;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
    this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
              new<Memory::HeapAllocator>(0x80,alloc,0x300d4a);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
              (this_00,L"Diagnostic",&this->threadContext->debugManager->diagnosticPageAllocator,
               Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
    this->diagnosticArena = (ArenaAllocator *)this_00;
  }
  if (this->diagnosticArena == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x5d8,"(this->diagnosticArena != nullptr)",
                                "this->diagnosticArena != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return this->diagnosticArena;
}

Assistant:

ArenaAllocator* ScriptContext::AllocatorForDiagnostics()
    {
        if (this->diagnosticArena == nullptr)
        {
            this->diagnosticArena = HeapNew(ArenaAllocator, _u("Diagnostic"), this->GetThreadContext()->GetDebugManager()->GetDiagnosticPageAllocator(), Throw::OutOfMemory);
        }
        Assert(this->diagnosticArena != nullptr);
        return this->diagnosticArena;
    }